

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

void duckdb::DictionaryVector::VerifyDictionary(Vector *vector)

{
  InternalException *this;
  VectorType VVar1;
  Vector *in_RDI;
  allocator local_29;
  string local_28 [40];
  
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 != DICTIONARY_VECTOR) {
    this = (InternalException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_28,
               "Operation requires a dictionary vector but a non-dictionary vector was encountered",
               &local_29);
    duckdb::InternalException::InternalException(this,local_28);
    __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return;
}

Assistant:

static void VerifyDictionary(const Vector &vector) {
#ifdef DUCKDB_DEBUG_NO_SAFETY
		D_ASSERT(vector.GetVectorType() == VectorType::DICTIONARY_VECTOR);
#else
		if (vector.GetVectorType() != VectorType::DICTIONARY_VECTOR) {
			throw InternalException(
			    "Operation requires a dictionary vector but a non-dictionary vector was encountered");
		}
#endif
	}